

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_Brep::SetTrimTolerances(ON_Brep *this,bool bLazy)

{
  int iVar1;
  uint uVar2;
  ON_BrepTrim *pOVar3;
  int local_18;
  int trim_count;
  int ti;
  bool rc;
  bool bLazy_local;
  ON_Brep *this_local;
  
  trim_count._2_1_ = true;
  iVar1 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    pOVar3 = ON_ClassArray<ON_BrepTrim>::operator[]
                       ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,local_18);
    uVar2 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])
                      (this,pOVar3,(ulong)bLazy);
    if ((uVar2 & 1) == 0) {
      trim_count._2_1_ = false;
    }
  }
  return trim_count._2_1_;
}

Assistant:

bool ON_Brep::SetTrimTolerances( bool bLazy )
{
  bool rc = true;
  int ti, trim_count = m_T.Count();
  for ( ti = 0; ti < trim_count; ti++ )
  {
    if ( !SetTrimTolerance( m_T[ti], bLazy ) )
      rc = false;
  }
  return rc;
}